

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_helpers.cc
# Opt level: O2

void google::protobuf::compiler::java::GenerateLarge
               (Printer *printer,EnumDescriptor *descriptor,
               vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
               *canonical_values,
               vector<std::pair<const_google::protobuf::EnumValueDescriptor_*,_const_google::protobuf::EnumValueDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::EnumValueDescriptor_*,_const_google::protobuf::EnumValueDescriptor_*>_>_>
               *aliases,bool immutable_api,Context *context,ClassNameResolver *name_resolver)

{
  ushort *puVar1;
  Printer *pPVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  AlphaNum *a;
  AlphaNum *a_00;
  double dVar7;
  undefined1 auVar8 [16];
  bool immutable_api_local;
  _Any_data local_1048;
  code *local_1038;
  code *pcStack_1030;
  Printer *printer_local;
  allocator<char> local_101d;
  allocator<char> local_101c;
  allocator<char> local_101b;
  allocator<char> local_101a;
  allocator<char> local_1019;
  Context *context_local;
  int interface_count;
  allocator<char> local_100c;
  allocator<char> local_100b;
  allocator<char> local_100a;
  allocator<char> local_1009;
  allocator<char> local_1008;
  allocator<char> local_1007;
  allocator<char> local_1006;
  allocator<char> local_1005;
  allocator<char> local_1004;
  allocator<char> local_1003;
  allocator<char> local_1002;
  allocator<char> local_1001;
  vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
  *local_1000;
  int start;
  undefined4 uStack_ff4;
  Printer *local_ff0;
  EnumDescriptor *descriptor_local;
  undefined1 *local_fe0;
  undefined8 local_fd8;
  undefined1 local_fd0;
  undefined7 uStack_fcf;
  undefined8 uStack_fc8;
  undefined1 *local_fc0;
  undefined8 local_fb8;
  undefined1 local_fb0;
  undefined7 uStack_faf;
  undefined8 uStack_fa8;
  char *local_fa0;
  size_type local_f98;
  char local_f90;
  undefined7 uStack_f8f;
  undefined8 uStack_f88;
  char *local_f80;
  size_type local_f78;
  char local_f70;
  undefined7 uStack_f6f;
  undefined8 uStack_f68;
  char *local_f60;
  size_type local_f58;
  char local_f50;
  undefined7 uStack_f4f;
  undefined8 uStack_f48;
  undefined1 *local_f40;
  undefined8 local_f38;
  undefined1 local_f30 [8];
  undefined8 uStack_f28;
  undefined1 *local_f20;
  undefined8 local_f18;
  undefined1 local_f10 [8];
  undefined8 uStack_f08;
  undefined1 *local_f00;
  undefined8 local_ef8;
  undefined1 local_ef0 [8];
  undefined8 uStack_ee8;
  undefined1 *local_ee0;
  undefined8 local_ed8;
  undefined1 local_ed0 [8];
  undefined8 uStack_ec8;
  undefined1 *local_ec0;
  undefined8 local_eb8;
  undefined1 local_eb0 [8];
  undefined8 uStack_ea8;
  undefined1 *local_ea0;
  undefined8 local_e98;
  undefined1 local_e90 [8];
  undefined8 uStack_e88;
  undefined1 *local_e80;
  undefined8 local_e78;
  undefined1 local_e70 [8];
  undefined8 uStack_e68;
  undefined1 *local_e60;
  undefined8 local_e58;
  undefined1 local_e50 [8];
  undefined8 uStack_e48;
  undefined1 *local_e40;
  undefined8 local_e38;
  undefined1 local_e30 [8];
  undefined8 uStack_e28;
  undefined1 *local_e20;
  undefined8 local_e18;
  undefined1 local_e10 [8];
  undefined8 uStack_e08;
  undefined1 *local_e00;
  undefined8 local_df8;
  undefined1 local_df0;
  undefined7 uStack_def;
  undefined8 uStack_de8;
  undefined1 *local_de0;
  undefined8 local_dd8;
  undefined1 local_dd0;
  undefined7 uStack_dcf;
  undefined8 uStack_dc8;
  Printer *local_dc0;
  char *local_db8;
  char *local_db0;
  basic_string_view<char,_std::char_traits<char>_> local_da8;
  string local_d98;
  string local_d78;
  string local_d58;
  string local_d38;
  string local_d18;
  string local_cf8;
  string local_cd8;
  Sub local_cb8 [2];
  undefined1 local_b48 [64];
  __index_type local_b08;
  _Alloc_hider local_b00;
  size_type local_af8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_af0;
  bool local_ae0;
  bool local_a98;
  undefined1 local_a90 [64];
  __index_type local_a50;
  _Alloc_hider local_a48;
  size_type local_a40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a38;
  bool local_a28;
  bool local_9e0;
  undefined1 local_9d8 [64];
  __index_type local_998;
  _Alloc_hider local_990;
  size_type local_988;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_980;
  bool local_970;
  bool local_928;
  undefined1 *local_920;
  undefined8 local_918;
  undefined1 local_910;
  undefined7 uStack_90f;
  undefined8 uStack_908;
  variant<std::__cxx11::string,std::function<bool()>> local_900 [32];
  char local_8e0;
  undefined1 *local_8d8;
  undefined8 local_8d0;
  undefined1 local_8c8 [16];
  undefined1 local_8b8;
  undefined1 local_870;
  undefined1 *local_868;
  undefined8 local_860;
  undefined1 local_858;
  undefined7 uStack_857;
  undefined8 uStack_850;
  variant<std::__cxx11::string,std::function<bool()>> local_848 [32];
  char local_828;
  undefined1 *local_820;
  undefined8 local_818;
  undefined1 local_810 [16];
  undefined1 local_800;
  undefined1 local_7b8;
  undefined1 *local_7b0;
  undefined8 local_7a8;
  undefined1 local_7a0 [8];
  undefined8 uStack_798;
  variant<std::__cxx11::string,std::function<bool()>> local_790 [32];
  char local_770;
  undefined1 *local_768;
  undefined8 local_760;
  undefined1 local_758 [16];
  undefined1 local_748;
  undefined1 local_700;
  undefined1 *local_6f8;
  undefined8 local_6f0;
  undefined1 local_6e8 [8];
  undefined8 uStack_6e0;
  variant<std::__cxx11::string,std::function<bool()>> local_6d8 [32];
  char local_6b8;
  undefined1 *local_6b0;
  undefined8 local_6a8;
  undefined1 local_6a0 [16];
  undefined1 local_690;
  undefined1 local_648;
  undefined1 *local_640;
  undefined8 local_638;
  undefined1 local_630 [8];
  undefined8 uStack_628;
  variant<std::__cxx11::string,std::function<bool()>> local_620 [32];
  char local_600;
  undefined1 *local_5f8;
  undefined8 local_5f0;
  undefined1 local_5e8 [16];
  undefined1 local_5d8;
  undefined1 local_590;
  undefined1 *local_588;
  undefined8 local_580;
  undefined1 local_578 [8];
  undefined8 uStack_570;
  variant<std::__cxx11::string,std::function<bool()>> local_568 [32];
  char local_548;
  undefined1 *local_540;
  undefined8 local_538;
  undefined1 local_530 [16];
  undefined1 local_520;
  undefined1 local_4d8;
  undefined1 *local_4d0;
  undefined8 local_4c8;
  undefined1 local_4c0 [8];
  undefined8 uStack_4b8;
  variant<std::__cxx11::string,std::function<bool()>> local_4b0 [32];
  char local_490;
  undefined1 *local_488;
  undefined8 local_480;
  undefined1 local_478 [16];
  undefined1 local_468;
  undefined1 local_420;
  undefined1 *local_418;
  undefined8 local_410;
  undefined1 local_408 [8];
  undefined8 uStack_400;
  variant<std::__cxx11::string,std::function<bool()>> local_3f8 [32];
  char local_3d8;
  undefined1 *local_3d0;
  undefined8 local_3c8;
  undefined1 local_3c0 [16];
  undefined1 local_3b0;
  undefined1 local_368;
  undefined1 *local_360;
  undefined8 local_358;
  undefined1 local_350 [8];
  undefined8 uStack_348;
  variant<std::__cxx11::string,std::function<bool()>> local_340 [32];
  char local_320;
  undefined1 *local_318;
  undefined8 local_310;
  undefined1 local_308 [16];
  undefined1 local_2f8;
  undefined1 local_2b0;
  undefined1 *local_2a8;
  undefined8 local_2a0;
  undefined1 local_298 [8];
  undefined8 uStack_290;
  variant<std::__cxx11::string,std::function<bool()>> local_288 [32];
  char local_268;
  undefined1 *local_260;
  undefined8 local_258;
  undefined1 local_250 [16];
  undefined1 local_240;
  undefined1 local_1f8;
  undefined1 *local_1f0;
  undefined8 local_1e8;
  undefined1 local_1e0 [8];
  undefined8 uStack_1d8;
  variant<std::__cxx11::string,std::function<bool()>> local_1d0 [32];
  char local_1b0;
  undefined1 *local_1a8;
  undefined8 local_1a0;
  undefined1 local_198 [16];
  undefined1 local_188;
  undefined1 local_140;
  undefined1 *local_138;
  undefined8 local_130;
  undefined1 local_128 [8];
  undefined8 uStack_120;
  variant<std::__cxx11::string,std::function<bool()>> local_118 [32];
  char local_f8;
  undefined1 *local_f0;
  undefined8 local_e8;
  undefined1 local_e0 [16];
  undefined1 local_d0;
  undefined1 local_88;
  string local_80;
  AlphaNum local_60;
  
  lVar5 = (long)(canonical_values->
                super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(canonical_values->
                super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
  lVar6 = lVar5 >> 3;
  auVar8._8_4_ = (int)(lVar5 >> 0x23);
  auVar8._0_8_ = lVar6;
  auVar8._12_4_ = 0x45300000;
  immutable_api_local = immutable_api;
  printer_local = printer;
  context_local = context;
  local_1000 = canonical_values;
  descriptor_local = descriptor;
  dVar7 = ceil(((auVar8._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) / 1000.0);
  interface_count = (int)dVar7;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_cf8,"classname",&local_1019);
  puVar1 = (ushort *)(descriptor->all_names_).payload_;
  local_da8._M_len = (size_t)*puVar1;
  local_da8._M_str = (char *)((long)puVar1 + ~local_da8._M_len);
  io::Printer::Sub::Sub<std::basic_string_view<char,std::char_traits<char>>>
            (local_cb8,&local_cf8,&local_da8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d18,"static",&local_101a);
  bVar3 = IsOwnFile<google::protobuf::EnumDescriptor>(descriptor_local,immutable_api_local);
  _start = " static ";
  if (bVar3) {
    _start = " ";
  }
  io::Printer::Sub::Sub<char_const*>(local_cb8 + 1,&local_d18,(char **)&start);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d38,"deprecation",&local_101b)
  ;
  local_db0 = anon_var_dwarf_651463 + 5;
  if ((descriptor_local->options_->field_0)._impl_.deprecated_ != false) {
    local_db0 = "@java.lang.Deprecated";
  }
  io::Printer::Sub::Sub<char_const*>((Sub *)local_b48,&local_d38,&local_db0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d58,"canonical_values_size",&local_101c);
  absl::lts_20250127::AlphaNum::AlphaNum
            (&local_60,
             (long)(local_1000->
                   super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(local_1000->
                   super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 3);
  absl::lts_20250127::StrCat_abi_cxx11_(&local_d98,(lts_20250127 *)&local_60,a);
  io::Printer::Sub::Sub<std::__cxx11::string>((Sub *)local_a90,&local_d58,&local_d98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d78,"proto_enum_class",&local_101d);
  local_db8 = "com.google.protobuf.ProtocolMessageEnum";
  if ((context_local->options_).enforce_lite != false) {
    local_db8 = "com.google.protobuf.Internal.EnumLite";
  }
  io::Printer::Sub::Sub<char_const*>((Sub *)local_9d8,&local_d78,&local_db8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_de0,"proto_non_null_annotation",&local_1001);
  local_920 = &local_910;
  if (local_de0 == &local_dd0) {
    uStack_908 = uStack_dc8;
  }
  else {
    local_920 = local_de0;
  }
  _local_910 = CONCAT71(uStack_dcf,local_dd0);
  local_918 = local_dd8;
  local_dd8 = 0;
  local_dd0 = 0;
  local_1038 = (code *)0x0;
  pcStack_1030 = (code *)0x0;
  local_1048._M_unused._M_object = (void *)0x0;
  local_1048._8_8_ = 0;
  local_de0 = &local_dd0;
  local_1048._M_unused._M_object = operator_new(0x18);
  *(Context ***)local_1048._M_unused._0_8_ = &context_local;
  *(Printer ***)((long)local_1048._M_unused._0_8_ + 8) = &printer_local;
  *(code *)((long)local_1048._M_unused._0_8_ + 0x10) = (code)0x0;
  pcStack_1030 = std::
                 _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                 ::_M_invoke;
  local_1038 = std::
               _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
               ::_M_manager;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            (local_900,(function<bool_()> *)&local_1048);
  std::_Function_base::~_Function_base((_Function_base *)&local_1048);
  local_8d8 = local_8c8;
  local_8d0 = 0;
  local_8c8[0] = 0;
  local_8b8 = 0;
  if (local_8e0 == '\x01') {
    std::__cxx11::string::assign((char *)&local_8d8);
  }
  local_870 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e00,"method_return_null_annotation",&local_1002);
  local_868 = &local_858;
  if (local_e00 == &local_df0) {
    uStack_850 = uStack_de8;
  }
  else {
    local_868 = local_e00;
  }
  _local_858 = CONCAT71(uStack_def,local_df0);
  local_860 = local_df8;
  local_df8 = 0;
  local_df0 = 0;
  local_1038 = (code *)0x0;
  pcStack_1030 = (code *)0x0;
  local_1048._M_unused._M_object = (void *)0x0;
  local_1048._8_8_ = 0;
  local_e00 = &local_df0;
  local_1048._M_unused._M_object = operator_new(0x18);
  *(Context ***)local_1048._M_unused._0_8_ = &context_local;
  *(Printer ***)((long)local_1048._M_unused._0_8_ + 8) = &printer_local;
  *(code *)((long)local_1048._M_unused._0_8_ + 0x10) = (code)0x0;
  pcStack_1030 = std::
                 _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                 ::_M_invoke;
  local_1038 = std::
               _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
               ::_M_manager;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            (local_848,(function<bool_()> *)&local_1048);
  std::_Function_base::~_Function_base((_Function_base *)&local_1048);
  local_820 = local_810;
  local_818 = 0;
  local_810[0] = 0;
  local_800 = 0;
  if (local_828 == '\x01') {
    std::__cxx11::string::assign((char *)&local_820);
  }
  local_7b8 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e20,"interface_names",&local_1003);
  local_7b0 = local_7a0;
  if (local_e20 == local_e10) {
    uStack_798 = uStack_e08;
  }
  else {
    local_7b0 = local_e20;
  }
  local_7a8 = local_e18;
  local_e18 = 0;
  local_e10[0] = 0;
  local_1038 = (code *)0x0;
  pcStack_1030 = (code *)0x0;
  local_1048._M_unused._M_object = (void *)0x0;
  local_1048._8_8_ = 0;
  local_ff0 = printer;
  local_e20 = local_e10;
  local_1048._M_unused._M_object = operator_new(0x20);
  *(int **)local_1048._M_unused._0_8_ = &interface_count;
  *(EnumDescriptor ***)((long)local_1048._M_unused._0_8_ + 8) = &descriptor_local;
  *(Printer ***)((long)local_1048._M_unused._0_8_ + 0x10) = &printer_local;
  *(code *)((long)local_1048._M_unused._0_8_ + 0x18) = (code)0x0;
  pcStack_1030 = std::
                 _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                 ::_M_invoke;
  local_1038 = std::
               _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
               ::_M_manager;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            (local_790,(function<bool_()> *)&local_1048);
  std::_Function_base::~_Function_base((_Function_base *)&local_1048);
  local_768 = local_758;
  local_760 = 0;
  local_758[0] = 0;
  local_748 = 0;
  if (local_770 == '\x01') {
    std::__cxx11::string::assign((char *)&local_768);
  }
  local_700 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e40,"gen_code_version_validator",&local_1004);
  local_6f8 = local_6e8;
  if (local_e40 == local_e30) {
    uStack_6e0 = uStack_e28;
  }
  else {
    local_6f8 = local_e40;
  }
  local_6f0 = local_e38;
  local_e38 = 0;
  local_e30[0] = 0;
  local_1038 = (code *)0x0;
  pcStack_1030 = (code *)0x0;
  local_1048._M_unused._M_object = (void *)0x0;
  local_1048._8_8_ = 0;
  local_e40 = local_e30;
  local_1048._M_unused._M_object = operator_new(0x20);
  *(Context ***)local_1048._M_unused._0_8_ = &context_local;
  *(Printer ***)((long)local_1048._M_unused._0_8_ + 8) = &printer_local;
  *(EnumDescriptor ***)((long)local_1048._M_unused._0_8_ + 0x10) = &descriptor_local;
  *(code *)((long)local_1048._M_unused._0_8_ + 0x18) = (code)0x0;
  pcStack_1030 = std::
                 _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                 ::_M_invoke;
  local_1038 = std::
               _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
               ::_M_manager;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            (local_6d8,(function<bool_()> *)&local_1048);
  std::_Function_base::~_Function_base((_Function_base *)&local_1048);
  local_6b0 = local_6a0;
  local_6a8 = 0;
  local_6a0[0] = 0;
  local_690 = 0;
  if (local_6b8 == '\x01') {
    std::__cxx11::string::assign((char *)&local_6b0);
  }
  local_648 = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e60,"aliases",&local_1005);
  local_640 = local_630;
  if (local_e60 == local_e50) {
    uStack_628 = uStack_e48;
  }
  else {
    local_640 = local_e60;
  }
  local_638 = local_e58;
  local_e58 = 0;
  local_e50[0] = 0;
  local_1038 = (code *)0x0;
  pcStack_1030 = (code *)0x0;
  local_1048._M_unused._M_object = (void *)0x0;
  local_1048._8_8_ = 0;
  local_e60 = local_e50;
  local_1048._M_unused._M_object = operator_new(0x28);
  *(vector<std::pair<const_google::protobuf::EnumValueDescriptor_*,_const_google::protobuf::EnumValueDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::EnumValueDescriptor_*,_const_google::protobuf::EnumValueDescriptor_*>_>_>
    **)local_1048._M_unused._0_8_ = aliases;
  *(Printer ***)((long)local_1048._M_unused._0_8_ + 8) = &printer_local;
  *(Context ***)((long)local_1048._M_unused._0_8_ + 0x10) = &context_local;
  *(vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
    **)((long)local_1048._M_unused._0_8_ + 0x18) = local_1000;
  *(code *)((long)local_1048._M_unused._0_8_ + 0x20) = (code)0x0;
  pcStack_1030 = std::
                 _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                 ::_M_invoke;
  local_1038 = std::
               _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
               ::_M_manager;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            (local_620,(function<bool_()> *)&local_1048);
  std::_Function_base::~_Function_base((_Function_base *)&local_1048);
  local_5f8 = local_5e8;
  local_5f0 = 0;
  local_5e8[0] = 0;
  local_5d8 = 0;
  if (local_600 == '\x01') {
    std::__cxx11::string::assign((char *)&local_5f8);
  }
  local_590 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e80,"get_number_func",&local_1006);
  local_588 = local_578;
  if (local_e80 == local_e70) {
    uStack_570 = uStack_e68;
  }
  else {
    local_588 = local_e80;
  }
  local_580 = local_e78;
  local_e78 = 0;
  local_e70[0] = 0;
  local_1038 = (code *)0x0;
  pcStack_1030 = (code *)0x0;
  local_1048._M_unused._M_object = (void *)0x0;
  local_1048._8_8_ = 0;
  local_e80 = local_e70;
  local_1048._M_unused._M_object = operator_new(0x18);
  *(EnumDescriptor ***)local_1048._M_unused._0_8_ = &descriptor_local;
  *(Printer ***)((long)local_1048._M_unused._0_8_ + 8) = &printer_local;
  *(code *)((long)local_1048._M_unused._0_8_ + 0x10) = (code)0x0;
  pcStack_1030 = std::
                 _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                 ::_M_invoke;
  local_1038 = std::
               _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
               ::_M_manager;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            (local_568,(function<bool_()> *)&local_1048);
  std::_Function_base::~_Function_base((_Function_base *)&local_1048);
  local_540 = local_530;
  local_538 = 0;
  local_530[0] = 0;
  local_520 = 0;
  if (local_548 == '\x01') {
    std::__cxx11::string::assign((char *)&local_540);
  }
  local_4d8 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ea0,"deprecated_value_of_func",&local_1007);
  local_4d0 = local_4c0;
  if (local_ea0 == local_e90) {
    uStack_4b8 = uStack_e88;
  }
  else {
    local_4d0 = local_ea0;
  }
  local_4c8 = local_e98;
  local_e98 = 0;
  local_e90[0] = 0;
  local_1038 = (code *)0x0;
  pcStack_1030 = (code *)0x0;
  local_1048._M_unused._M_object = (void *)0x0;
  local_1048._8_8_ = 0;
  local_ea0 = local_e90;
  local_1048._M_unused._M_object = operator_new(0x18);
  *(Context ***)local_1048._M_unused._0_8_ = &context_local;
  *(Printer ***)((long)local_1048._M_unused._0_8_ + 8) = &printer_local;
  *(code *)((long)local_1048._M_unused._0_8_ + 0x10) = (code)0x0;
  pcStack_1030 = std::
                 _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                 ::_M_invoke;
  local_1038 = std::
               _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
               ::_M_manager;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            (local_4b0,(function<bool_()> *)&local_1048);
  std::_Function_base::~_Function_base((_Function_base *)&local_1048);
  local_488 = local_478;
  local_480 = 0;
  local_478[0] = 0;
  local_468 = 0;
  if (local_490 == '\x01') {
    std::__cxx11::string::assign((char *)&local_488);
  }
  local_420 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ec0,"for_number_func",&local_1008);
  local_418 = local_408;
  if (local_ec0 == local_eb0) {
    uStack_400 = uStack_ea8;
  }
  else {
    local_418 = local_ec0;
  }
  local_410 = local_eb8;
  local_eb8 = 0;
  local_eb0[0] = 0;
  local_1038 = (code *)0x0;
  pcStack_1030 = (code *)0x0;
  local_1048._M_unused._M_object = (void *)0x0;
  local_1048._8_8_ = 0;
  local_ec0 = local_eb0;
  local_1048._M_unused._M_object = operator_new(0x18);
  *(int **)local_1048._M_unused._0_8_ = &interface_count;
  *(Printer ***)((long)local_1048._M_unused._0_8_ + 8) = &printer_local;
  *(code *)((long)local_1048._M_unused._0_8_ + 0x10) = (code)0x0;
  pcStack_1030 = std::
                 _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                 ::_M_invoke;
  local_1038 = std::
               _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
               ::_M_manager;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            (local_3f8,(function<bool_()> *)&local_1048);
  std::_Function_base::~_Function_base((_Function_base *)&local_1048);
  local_3d0 = local_3c0;
  local_3c8 = 0;
  local_3c0[0] = 0;
  local_3b0 = 0;
  if (local_3d8 == '\x01') {
    std::__cxx11::string::assign((char *)&local_3d0);
  }
  local_368 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ee0,"value_of_func",&local_1009);
  local_360 = local_350;
  if (local_ee0 == local_ed0) {
    uStack_348 = uStack_ec8;
  }
  else {
    local_360 = local_ee0;
  }
  local_358 = local_ed8;
  local_ed8 = 0;
  local_ed0[0] = 0;
  local_1038 = (code *)0x0;
  pcStack_1030 = (code *)0x0;
  local_1048._M_unused._M_object = (void *)0x0;
  local_1048._8_8_ = 0;
  local_ee0 = local_ed0;
  local_1048._M_unused._M_object = operator_new(0x18);
  *(int **)local_1048._M_unused._0_8_ = &interface_count;
  *(Printer ***)((long)local_1048._M_unused._0_8_ + 8) = &printer_local;
  *(code *)((long)local_1048._M_unused._0_8_ + 0x10) = (code)0x0;
  pcStack_1030 = std::
                 _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                 ::_M_invoke;
  local_1038 = std::
               _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
               ::_M_manager;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            (local_340,(function<bool_()> *)&local_1048);
  std::_Function_base::~_Function_base((_Function_base *)&local_1048);
  local_318 = local_308;
  local_310 = 0;
  local_308[0] = 0;
  local_2f8 = 0;
  if (local_320 == '\x01') {
    std::__cxx11::string::assign((char *)&local_318);
  }
  local_2b0 = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f00,"values_func",&local_100a)
  ;
  local_2a8 = local_298;
  if (local_f00 == local_ef0) {
    uStack_290 = uStack_ee8;
  }
  else {
    local_2a8 = local_f00;
  }
  local_2a0 = local_ef8;
  local_ef8 = 0;
  local_ef0[0] = 0;
  local_1038 = (code *)0x0;
  pcStack_1030 = (code *)0x0;
  local_1048._M_unused._M_object = (void *)0x0;
  local_1048._8_8_ = 0;
  local_f00 = local_ef0;
  local_1048._M_unused._M_object = operator_new(0x20);
  *(Printer ***)local_1048._M_unused._0_8_ = &printer_local;
  *(EnumDescriptor ***)((long)local_1048._M_unused._0_8_ + 8) = &descriptor_local;
  *(int **)((long)local_1048._M_unused._0_8_ + 0x10) = &interface_count;
  *(code *)((long)local_1048._M_unused._0_8_ + 0x18) = (code)0x0;
  pcStack_1030 = std::
                 _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                 ::_M_invoke;
  local_1038 = std::
               _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
               ::_M_manager;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            (local_288,(function<bool_()> *)&local_1048);
  std::_Function_base::~_Function_base((_Function_base *)&local_1048);
  local_260 = local_250;
  local_258 = 0;
  local_250[0] = 0;
  local_240 = 0;
  if (local_268 == '\x01') {
    std::__cxx11::string::assign((char *)&local_260);
  }
  local_1f8 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f20,"enum_verifier_func",&local_100b);
  local_1f0 = local_1e0;
  if (local_f20 == local_f10) {
    uStack_1d8 = uStack_f08;
  }
  else {
    local_1f0 = local_f20;
  }
  local_1e8 = local_f18;
  local_f18 = 0;
  local_f10[0] = 0;
  local_1038 = (code *)0x0;
  pcStack_1030 = (code *)0x0;
  local_1048._M_unused._M_object = (void *)0x0;
  local_1048._8_8_ = 0;
  local_f20 = local_f10;
  local_1048._M_unused._M_object = operator_new(0x18);
  *(Context ***)local_1048._M_unused._0_8_ = &context_local;
  *(Printer ***)((long)local_1048._M_unused._0_8_ + 8) = &printer_local;
  *(code *)((long)local_1048._M_unused._0_8_ + 0x10) = (code)0x0;
  pcStack_1030 = std::
                 _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                 ::_M_invoke;
  local_1038 = std::
               _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
               ::_M_manager;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            (local_1d0,(function<bool_()> *)&local_1048);
  std::_Function_base::~_Function_base((_Function_base *)&local_1048);
  local_1a8 = local_198;
  local_1a0 = 0;
  local_198[0] = 0;
  local_188 = 0;
  if (local_1b0 == '\x01') {
    std::__cxx11::string::assign((char *)&local_1a8);
  }
  local_140 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f40,"descriptor_methods",&local_100c);
  pPVar2 = local_ff0;
  local_138 = local_128;
  if (local_f40 == local_f30) {
    uStack_120 = uStack_f28;
  }
  else {
    local_138 = local_f40;
  }
  local_130 = local_f38;
  local_f38 = 0;
  local_f30[0] = 0;
  local_1038 = (code *)0x0;
  pcStack_1030 = (code *)0x0;
  local_1048._M_unused._M_object = (void *)0x0;
  local_1048._8_8_ = 0;
  local_f40 = local_f30;
  local_1048._M_unused._M_object = operator_new(0x30);
  *(EnumDescriptor ***)local_1048._M_unused._0_8_ = &descriptor_local;
  *(Context ***)((long)local_1048._M_unused._0_8_ + 8) = &context_local;
  *(Printer ***)((long)local_1048._M_unused._0_8_ + 0x10) = &printer_local;
  *(ClassNameResolver ***)((long)local_1048._M_unused._0_8_ + 0x18) = &name_resolver;
  *(bool **)((long)local_1048._M_unused._0_8_ + 0x20) = &immutable_api_local;
  *(code *)((long)local_1048._M_unused._0_8_ + 0x28) = (code)0x0;
  pcStack_1030 = std::
                 _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                 ::_M_invoke;
  local_1038 = std::
               _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
               ::_M_manager;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            (local_118,(function<bool_()> *)&local_1048);
  std::_Function_base::~_Function_base((_Function_base *)&local_1048);
  local_f0 = local_e0;
  local_e8 = 0;
  local_e0[0] = 0;
  local_d0 = 0;
  if (local_f8 == '\x01') {
    std::__cxx11::string::assign((char *)&local_f0);
  }
  local_88 = 0;
  io::Printer::Emit(pPVar2,local_cb8,0x11,0x9a7,
                    "\n        $proto_non_null_annotation$\n        $deprecation$\n        public$static$final class $classname$\n          implements $proto_enum_class$, java.io.Serializable, $interface_names$ {\n          static {\n            $gen_code_version_validator$\n          }\n\n          public static final $classname$ UNRECOGNIZED = new $classname$(-1, $canonical_values_size$, \"UNRECOGNIZED\");\n\n          $aliases$\n\n          $deprecated_value_of_func$\n\n          public final int getNumber() {\n            $get_number_func$\n          }\n\n          /**\n           * @param value The numeric wire value of the corresponding enum entry.\n           * @return The enum associated with the given numeric wire value.\n           */\n          $method_return_null_annotation$\n          public static $classname$ forNumber(int value) {\n            $for_number_func$\n          }\n\n          /**\n           * @param name The string name of the corresponding enum entry.\n           * @return The enum associated with the given string name.\n           */\n          public static $classname$ valueOf(String name) {\n            $value_of_func$\n          }\n\n          public static $classname$[] values() {\n            $values_func$\n          }\n\n          private final int value;\n          private final String name;\n          private final int index;\n\n          $classname$(int v, int i, String n) {\n            this.value = v;\n            this.index = i;\n            this.name = n;\n          }\n\n          public int index() {\n            return index;\n          }\n\n          public int value() {\n            return value;\n          }\n\n          public String name() {\n            return name;\n          }\n\n          // For Kotlin code.\n          public String getName() {\n            return name;\n          }\n\n          @java.lang.Override\n          public String toString() {\n            return name;\n          }\n\n          public static com.google.protobuf.Internal.EnumLiteMap<$classname$> internalGetValueMap() {\n            return internalValueMap;\n          }\n\n          p..." /* TRUNCATED STRING LITERAL */
                   );
  lVar5 = 0xb80;
  do {
    io::Printer::Sub::~Sub((Sub *)((long)&local_cb8[0].key_._M_dataplus._M_p + lVar5));
    lVar5 = lVar5 + -0xb8;
  } while (lVar5 != -0xb8);
  std::__cxx11::string::~string((string *)&local_f40);
  std::__cxx11::string::~string((string *)&local_f20);
  std::__cxx11::string::~string((string *)&local_f00);
  std::__cxx11::string::~string((string *)&local_ee0);
  std::__cxx11::string::~string((string *)&local_ec0);
  std::__cxx11::string::~string((string *)&local_ea0);
  std::__cxx11::string::~string((string *)&local_e80);
  std::__cxx11::string::~string((string *)&local_e60);
  std::__cxx11::string::~string((string *)&local_e40);
  std::__cxx11::string::~string((string *)&local_e20);
  std::__cxx11::string::~string((string *)&local_e00);
  std::__cxx11::string::~string((string *)&local_de0);
  std::__cxx11::string::~string((string *)&local_d78);
  std::__cxx11::string::~string((string *)&local_d98);
  std::__cxx11::string::~string((string *)&local_d58);
  std::__cxx11::string::~string((string *)&local_d38);
  std::__cxx11::string::~string((string *)&local_d18);
  std::__cxx11::string::~string((string *)&local_cf8);
  iVar4 = 0;
  while (iVar4 < interface_count) {
    local_ff0 = (Printer *)CONCAT44(local_ff0._4_4_,iVar4);
    _start = (char *)CONCAT44(uStack_ff4,iVar4 * 1000);
    local_dc0 = printer_local;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_cd8,"classname",(allocator<char> *)&local_db0);
    puVar1 = (ushort *)(descriptor_local->all_names_).payload_;
    local_da8._M_len = (size_t)*puVar1;
    local_da8._M_str = (char *)((long)puVar1 + ~local_da8._M_len);
    io::Printer::Sub::Sub<std::basic_string_view<char,std::char_traits<char>>>
              (local_cb8,&local_cd8,&local_da8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"count",(allocator<char> *)&local_db8);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_60,(int)local_ff0);
    absl::lts_20250127::StrCat_abi_cxx11_(&local_d98,(lts_20250127 *)&local_60,a_00);
    io::Printer::Sub::Sub<std::__cxx11::string>(local_cb8 + 1,&local_80,&local_d98);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f60,"method_return_null_annotation",&local_1019);
    local_b48._8_8_ = local_f58;
    local_b48._0_8_ = local_b48 + 0x10;
    if (local_f60 == &local_f50) {
      local_b48._24_8_ = uStack_f48;
    }
    else {
      local_b48._0_8_ = local_f60;
    }
    local_b48._17_7_ = uStack_f4f;
    local_b48[0x10] = local_f50;
    local_f58 = 0;
    local_f50 = '\0';
    local_1038 = (code *)0x0;
    pcStack_1030 = (code *)0x0;
    local_1048._M_unused._M_object = (void *)0x0;
    local_1048._8_8_ = 0;
    local_f60 = &local_f50;
    local_1048._M_unused._M_object = operator_new(0x18);
    *(Context ***)local_1048._M_unused._0_8_ = &context_local;
    *(Printer ***)((long)local_1048._M_unused._0_8_ + 8) = &printer_local;
    *(code *)((long)local_1048._M_unused._0_8_ + 0x10) = (code)0x0;
    pcStack_1030 = std::
                   _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                   ::_M_invoke;
    local_1038 = std::
                 _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                 ::_M_manager;
    std::variant<std::__cxx11::string,std::function<bool()>>::
    variant<std::function<bool()>,void,void,std::function<bool()>,void>
              ((variant<std::__cxx11::string,std::function<bool()>> *)(local_b48 + 0x20),
               (function<bool_()> *)&local_1048);
    std::_Function_base::~_Function_base((_Function_base *)&local_1048);
    local_b00._M_p = (pointer)&local_af0;
    local_af8 = 0;
    local_af0._M_local_buf[0] = '\0';
    local_ae0 = false;
    if (local_b08 == '\x01') {
      std::__cxx11::string::assign((char *)&local_b00);
    }
    local_a98 = false;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f80,"enums",&local_101a);
    local_a90._8_8_ = local_f78;
    local_a90._0_8_ = local_a90 + 0x10;
    if (local_f80 == &local_f70) {
      local_a90._24_8_ = uStack_f68;
    }
    else {
      local_a90._0_8_ = local_f80;
    }
    local_a90._17_7_ = uStack_f6f;
    local_a90[0x10] = local_f70;
    local_f78 = 0;
    local_f70 = '\0';
    local_1038 = (code *)0x0;
    pcStack_1030 = (code *)0x0;
    local_1048._M_unused._M_object = (void *)0x0;
    local_1048._8_8_ = 0;
    local_f80 = &local_f70;
    local_1048._M_unused._M_object = operator_new(0x28);
    *(int **)local_1048._M_unused._0_8_ = &start;
    *(vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
      **)((long)local_1048._M_unused._0_8_ + 8) = local_1000;
    *(Printer ***)((long)local_1048._M_unused._0_8_ + 0x10) = &printer_local;
    *(Context ***)((long)local_1048._M_unused._0_8_ + 0x18) = &context_local;
    *(code *)((long)local_1048._M_unused._0_8_ + 0x20) = (code)0x0;
    pcStack_1030 = std::
                   _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                   ::_M_invoke;
    local_1038 = std::
                 _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                 ::_M_manager;
    std::variant<std::__cxx11::string,std::function<bool()>>::
    variant<std::function<bool()>,void,void,std::function<bool()>,void>
              ((variant<std::__cxx11::string,std::function<bool()>> *)(local_a90 + 0x20),
               (function<bool_()> *)&local_1048);
    std::_Function_base::~_Function_base((_Function_base *)&local_1048);
    local_a48._M_p = (pointer)&local_a38;
    local_a40 = 0;
    local_a38._M_local_buf[0] = '\0';
    local_a28 = false;
    if (local_a50 == '\x01') {
      std::__cxx11::string::assign((char *)&local_a48);
    }
    local_9e0 = false;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_fa0,"value_of_func",&local_101b);
    local_9d8._8_8_ = local_f98;
    local_9d8._0_8_ = local_9d8 + 0x10;
    if (local_fa0 == &local_f90) {
      local_9d8._24_8_ = uStack_f88;
    }
    else {
      local_9d8._0_8_ = local_fa0;
    }
    local_9d8._17_7_ = uStack_f8f;
    local_9d8[0x10] = local_f90;
    local_f98 = 0;
    local_f90 = '\0';
    local_1038 = (code *)0x0;
    pcStack_1030 = (code *)0x0;
    local_1048._M_unused._M_object = (void *)0x0;
    local_1048._8_8_ = 0;
    local_fa0 = &local_f90;
    local_1048._M_unused._M_object = operator_new(0x20);
    *(Printer ***)local_1048._M_unused._0_8_ = &printer_local;
    *(int **)((long)local_1048._M_unused._0_8_ + 8) = &start;
    *(vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
      **)((long)local_1048._M_unused._0_8_ + 0x10) = local_1000;
    *(code *)((long)local_1048._M_unused._0_8_ + 0x18) = (code)0x0;
    pcStack_1030 = std::
                   _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                   ::_M_invoke;
    local_1038 = std::
                 _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                 ::_M_manager;
    std::variant<std::__cxx11::string,std::function<bool()>>::
    variant<std::function<bool()>,void,void,std::function<bool()>,void>
              ((variant<std::__cxx11::string,std::function<bool()>> *)(local_9d8 + 0x20),
               (function<bool_()> *)&local_1048);
    std::_Function_base::~_Function_base((_Function_base *)&local_1048);
    local_990._M_p = (pointer)&local_980;
    local_988 = 0;
    local_980._M_local_buf[0] = '\0';
    local_970 = false;
    if (local_998 == '\x01') {
      std::__cxx11::string::assign((char *)&local_990);
    }
    local_928 = false;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_fc0,"for_number_func",&local_101c);
    local_918 = local_fb8;
    local_920 = &local_910;
    if (local_fc0 == &local_fb0) {
      uStack_908 = uStack_fa8;
    }
    else {
      local_920 = local_fc0;
    }
    _local_910 = CONCAT71(uStack_faf,local_fb0);
    local_fb8 = 0;
    local_fb0 = 0;
    local_1038 = (code *)0x0;
    pcStack_1030 = (code *)0x0;
    local_1048._M_unused._M_object = (void *)0x0;
    local_1048._8_8_ = 0;
    local_fc0 = &local_fb0;
    local_1048._M_unused._M_object = operator_new(0x20);
    *(Printer ***)local_1048._M_unused._0_8_ = &printer_local;
    *(int **)((long)local_1048._M_unused._0_8_ + 8) = &start;
    *(vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
      **)((long)local_1048._M_unused._0_8_ + 0x10) = local_1000;
    *(code *)((long)local_1048._M_unused._0_8_ + 0x18) = (code)0x0;
    pcStack_1030 = std::
                   _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                   ::_M_invoke;
    local_1038 = std::
                 _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                 ::_M_manager;
    std::variant<std::__cxx11::string,std::function<bool()>>::
    variant<std::function<bool()>,void,void,std::function<bool()>,void>
              (local_900,(function<bool_()> *)&local_1048);
    std::_Function_base::~_Function_base((_Function_base *)&local_1048);
    local_8d8 = local_8c8;
    local_8d0 = 0;
    local_8c8[0] = 0;
    local_8b8 = 0;
    if (local_8e0 == '\x01') {
      std::__cxx11::string::assign((char *)&local_8d8);
    }
    local_870 = 0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_fe0,"values_func",&local_101d);
    local_860 = local_fd8;
    local_868 = &local_858;
    if (local_fe0 == &local_fd0) {
      uStack_850 = uStack_fc8;
    }
    else {
      local_868 = local_fe0;
    }
    _local_858 = CONCAT71(uStack_fcf,local_fd0);
    local_fd8 = 0;
    local_fd0 = 0;
    local_1038 = (code *)0x0;
    pcStack_1030 = (code *)0x0;
    local_1048._M_unused._M_object = (void *)0x0;
    local_1048._8_8_ = 0;
    local_fe0 = &local_fd0;
    local_1048._M_unused._M_object = operator_new(0x20);
    *(Printer ***)local_1048._M_unused._0_8_ = &printer_local;
    *(int **)((long)local_1048._M_unused._0_8_ + 8) = &start;
    *(vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
      **)((long)local_1048._M_unused._0_8_ + 0x10) = local_1000;
    *(code *)((long)local_1048._M_unused._0_8_ + 0x18) = (code)0x0;
    pcStack_1030 = std::
                   _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                   ::_M_invoke;
    local_1038 = std::
                 _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                 ::_M_manager;
    std::variant<std::__cxx11::string,std::function<bool()>>::
    variant<std::function<bool()>,void,void,std::function<bool()>,void>
              (local_848,(function<bool_()> *)&local_1048);
    std::_Function_base::~_Function_base((_Function_base *)&local_1048);
    local_820 = local_810;
    local_818 = 0;
    local_810[0] = 0;
    local_800 = 0;
    if (local_828 == '\x01') {
      std::__cxx11::string::assign((char *)&local_820);
    }
    local_7b8 = 0;
    io::Printer::Emit(local_dc0,local_cb8,7,0x369,
                      "\n          interface $classname$$count$ {\n\n            $enums$\n\n            /**\n             * @param value The numeric wire value of the corresponding enum entry.\n             * @return The enum associated with the given numeric wire value.\n             */\n            $method_return_null_annotation$\n            public static $classname$ forNumber$count$(int value) {\n              $for_number_func$\n            }\n\n            /**\n             * @param name The string name of the corresponding enum entry.\n             * @return The enum associated with the given string name.\n             */\n            $method_return_null_annotation$\n            public static $classname$ valueOf$count$(String name) {\n              $value_of_func$\n            }\n\n            public static $classname$[] values$count$() {\n              $values_func$\n            }\n          }\n        "
                     );
    lVar5 = 0x450;
    do {
      io::Printer::Sub::~Sub((Sub *)((long)&local_cb8[0].key_._M_dataplus._M_p + lVar5));
      lVar5 = lVar5 + -0xb8;
    } while (lVar5 != -0xb8);
    std::__cxx11::string::~string((string *)&local_fe0);
    std::__cxx11::string::~string((string *)&local_fc0);
    std::__cxx11::string::~string((string *)&local_fa0);
    std::__cxx11::string::~string((string *)&local_f80);
    std::__cxx11::string::~string((string *)&local_f60);
    std::__cxx11::string::~string((string *)&local_d98);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_cd8);
    iVar4 = (int)local_ff0 + 1;
  }
  return;
}

Assistant:

void GenerateLarge(
    io::Printer* printer, const EnumDescriptor* descriptor,
    std::vector<const EnumValueDescriptor*> canonical_values,
    std::vector<
        std::pair<const EnumValueDescriptor*, const EnumValueDescriptor*>>
        aliases,
    bool immutable_api, Context* context, ClassNameResolver* name_resolver) {
  // Max number of constants in a generated Java class.
  constexpr int kMaxEnums = 1000;
  int interface_count = ceil((double)canonical_values.size() / kMaxEnums);

  printer->Emit(
      {{"classname", descriptor->name()},
       {"static", IsOwnFile(descriptor, immutable_api) ? " " : " static "},
       {"deprecation",
        descriptor->options().deprecated() ? "@java.lang.Deprecated" : ""},
       {"canonical_values_size", absl::StrCat(canonical_values.size())},
       {"proto_enum_class", context->EnforceLite()
                                ? "com.google.protobuf.Internal.EnumLite"
                                : "com.google.protobuf.ProtocolMessageEnum"},
       {"proto_non_null_annotation",
        [&] {
          if (!context->options().opensource_runtime) {
            printer->Emit(R"(
              @com.google.protobuf.Internal.ProtoNonnullApi
            )");
          }
        }},
       {"method_return_null_annotation",
        [&] {
          if (!context->options().opensource_runtime) {
            printer->Emit(R"(
              @com.google.protobuf.Internal.ProtoMethodMayReturnNull
            )");
          }
        }},
       {"interface_names",
        [&] {
          std::vector<std::string> interface_names;
          interface_names.reserve(interface_count);
          for (int count = 0; count < interface_count; count++) {
            interface_names.push_back(
                absl::StrFormat("%s%d", descriptor->name(), count));
          }
          printer->Emit(
              {{"interface_names", absl::StrJoin(interface_names, ", ")}},
              R"($interface_names$)");
        }},
       {"gen_code_version_validator",
        [&] {
          if (!context->EnforceLite()) {
            PrintGencodeVersionValidator(printer,
                                         context->options().opensource_runtime,
                                         descriptor->name());
          }
        }},
       {"aliases",
        [&] {
          for (int i = 0; i < aliases.size(); i++) {
            WriteEnumValueDocComment(printer, aliases[i].first,
                                     context->options());
            printer->Emit({{"name", aliases[i].first->name()},
                           {"canonical_name", aliases[i].second->name()}},
                          R"(
                  public static final $classname$ $name$ = $canonical_name$;
                )");
            printer->Annotate("name", canonical_values[i]);
          }
        }},
       {"get_number_func",
        [&] {
          if (!descriptor->is_closed()) {
            printer->Emit(R"(
                if (this == UNRECOGNIZED) {
                  throw new java.lang.IllegalArgumentException(
                    "Can't get the number of an unknown enum value.");
                }
              )");
          }
          printer->Emit(R"(
            return value;
          )");
        }},
       {"deprecated_value_of_func",
        [&] {
          if (context->options().opensource_runtime) {
            printer->Emit(R"(
              /**
               * @param value The numeric wire value of the corresponding enum entry.
               * @return The enum associated with the given numeric wire value.
               * @deprecated Use {@link #forNumber(int)} instead.
               */
              @java.lang.Deprecated
              public static $classname$ valueOf(int value) {
                return forNumber(value);
              }
          )");
          }
        }},
       {"for_number_func",
        [&] {
          for (int count = 0; count < interface_count; count++) {
            printer->Emit({{"count", absl::StrCat(count)}}, R"(
                if ($classname$$count$.forNumber$count$(value) != null) {
                  return $classname$$count$.forNumber$count$(value);
                }
                )");
          }
          printer->Emit(R"(
                return null;
                )");
        }},
       {"value_of_func",
        [&] {
          for (int count = 0; count < interface_count; count++) {
            printer->Emit({{"count", absl::StrCat(count)}}, R"(
              if ($classname$$count$.valueOf$count$(name) != null) {
                return $classname$$count$.valueOf$count$(name);
              }
            )");
          }
          printer->Emit(R"(
              throw new java.lang.IllegalArgumentException(
                "No enum constant $classname$." + name);
          )");
        }},
       {"values_func",
        [&] {
          printer->Emit({{"size", absl::StrCat(descriptor->value_count() + 1)}},
                        R"(
              int ordinal = 0;
              $classname$[] values = new $classname$[$size$];
          )");

          for (int count = 0; count < interface_count; count++) {
            printer->Emit({{"count", absl::StrCat(count)}}, R"(
              $classname$[] values$count$ = $classname$$count$.values$count$();
              System.arraycopy(values$count$, 0, values, ordinal, values$count$.length);
              ordinal += values$count$.length;
            )");
          }
          printer->Emit(
              {{"last_index", absl::StrCat(descriptor->value_count())}}, R"(
              values[$last_index$] = UNRECOGNIZED;
              return values;
          )");
        }},
       {"enum_verifier_func",
        [&] {
          if (context->EnforceLite()) {
            printer->Emit(R"(
                public static com.google.protobuf.Internal.EnumVerifier
                    internalGetVerifier() {
                  return $classname$Verifier.INSTANCE;
                }

                private static final class $classname$Verifier implements
                     com.google.protobuf.Internal.EnumVerifier {
                        static final com.google.protobuf.Internal.EnumVerifier
                          INSTANCE = new $classname$Verifier();
                        @java.lang.Override
                        public boolean isInRange(int number) {
                          return $classname$.forNumber(number) != null;
                        }
                      };
            )");
          }
        }},
       {"descriptor_methods",
        [&] {
          // -----------------------------------------------------------------
          // Reflection

          if (HasDescriptorMethods(descriptor, context->EnforceLite())) {
            printer->Print(
                "public final "
                "com.google.protobuf.Descriptors.EnumValueDescriptor\n"
                "    getValueDescriptor() {\n");
            if (!descriptor->is_closed()) {
              printer->Print(
                  "  if (this == UNRECOGNIZED) {\n"
                  "    throw new java.lang.IllegalStateException(\n"
                  "        \"Can't get the descriptor of an unrecognized enum "
                  "value.\");\n"
                  "  }\n");
            }
            printer->Print(
                "  return getDescriptor().getValues().get(index());\n"
                "}\n"
                "public final com.google.protobuf.Descriptors.EnumDescriptor\n"
                "    getDescriptorForType() {\n"
                "  return getDescriptor();\n"
                "}\n"
                "public static final "
                "com.google.protobuf.Descriptors.EnumDescriptor\n"
                "    getDescriptor() {\n");

            // TODO:  Cache statically?  Note that we can't access
            // descriptors
            //   at module init time because it wouldn't work with
            //   descriptor.proto, but we can cache the value the first time
            //   getDescriptor() is called.
            if (descriptor->containing_type() == nullptr) {
              // The class generated for the File fully populates the descriptor
              // with extensions in both the mutable and immutable cases. (In
              // the mutable api this is accomplished by attempting to load the
              // immutable outer class).
              printer->Print(
                  "  return "
                  "$file$.getDescriptor().getEnumTypes().get($index$);\n",
                  "file",
                  name_resolver->GetClassName(descriptor->file(),
                                              immutable_api),
                  "index", absl::StrCat(descriptor->index()));
            } else {
              printer->Print(
                  "  return "
                  "$parent$.$descriptor$.getEnumTypes().get($index$);\n",
                  "parent",
                  name_resolver->GetClassName(descriptor->containing_type(),
                                              immutable_api),
                  "descriptor",
                  descriptor->containing_type()
                          ->options()
                          .no_standard_descriptor_accessor()
                      ? "getDefaultInstance().getDescriptorForType()"
                      : "getDescriptor()",
                  "index", absl::StrCat(descriptor->index()));
            }
            printer->Print(
                "}\n"
                "\n");

            printer->Print(
                "\n"
                "public static $classname$ valueOf(\n"
                "    com.google.protobuf.Descriptors.EnumValueDescriptor desc) "
                "{\n"
                "  if (desc.getType() != getDescriptor()) {\n"
                "    throw new java.lang.IllegalArgumentException(\n"
                "      \"EnumValueDescriptor is not for this type.\");\n"
                "  }\n",
                "classname", descriptor->name());
            if (!descriptor->is_closed()) {
              printer->Print(
                  "  if (desc.getIndex() == -1) {\n"
                  "    return UNRECOGNIZED;\n"
                  "  }\n");
            }
            printer->Print(
                "  return values()[desc.getIndex()];\n"
                "}\n"
                "\n");
          }
        }}},
      R"(
        $proto_non_null_annotation$
        $deprecation$
        public$static$final class $classname$
          implements $proto_enum_class$, java.io.Serializable, $interface_names$ {
          static {
            $gen_code_version_validator$
          }

          public static final $classname$ UNRECOGNIZED = new $classname$(-1, $canonical_values_size$, "UNRECOGNIZED");

          $aliases$

          $deprecated_value_of_func$

          public final int getNumber() {
            $get_number_func$
          }

          /**
           * @param value The numeric wire value of the corresponding enum entry.
           * @return The enum associated with the given numeric wire value.
           */
          $method_return_null_annotation$
          public static $classname$ forNumber(int value) {
            $for_number_func$
          }

          /**
           * @param name The string name of the corresponding enum entry.
           * @return The enum associated with the given string name.
           */
          public static $classname$ valueOf(String name) {
            $value_of_func$
          }

          public static $classname$[] values() {
            $values_func$
          }

          private final int value;
          private final String name;
          private final int index;

          $classname$(int v, int i, String n) {
            this.value = v;
            this.index = i;
            this.name = n;
          }

          public int index() {
            return index;
          }

          public int value() {
            return value;
          }

          public String name() {
            return name;
          }

          // For Kotlin code.
          public String getName() {
            return name;
          }

          @java.lang.Override
          public String toString() {
            return name;
          }

          public static com.google.protobuf.Internal.EnumLiteMap<$classname$> internalGetValueMap() {
            return internalValueMap;
          }

          private static final com.google.protobuf.Internal.EnumLiteMap<
            $classname$> internalValueMap =
              new com.google.protobuf.Internal.EnumLiteMap<$classname$>() {
                public $classname$ findValueByNumber(int number) {
                  return $classname$.forNumber(number);
                }
              };

          $enum_verifier_func$

          $descriptor_methods$
        }

        )");

  for (int count = 0; count < interface_count; count++) {
    int start = count * kMaxEnums;
    printer->Emit(
        {{"classname", descriptor->name()},
         {"count", absl::StrCat(count)},
         {"method_return_null_annotation",
          [&] {
            if (!context->options().opensource_runtime) {
              printer->Emit(R"(
                          @com.google.protobuf.Internal.ProtoMethodMayReturnNull
                        )");
            }
          }},
         {"enums",
          [&] {
            for (int i = start;
                 i < std::min(start + kMaxEnums, (int)canonical_values.size());
                 i++) {
              WriteEnumValueDocComment(printer, canonical_values[i],
                                       context->options());
              printer->Emit(
                  {
                      {"name", canonical_values[i]->name()},
                      {"number", absl::StrCat(canonical_values[i]->number())},
                      {"index", absl::StrCat(canonical_values[i]->index())},
                      {"deprecation",
                       canonical_values[i]->options().deprecated()
                           ? "@java.lang.Deprecated"
                           : ""},
                  },
                  R"(
                    $deprecation$
                    public static final $classname$ $name$ = new $classname$($number$, $index$, "$name$");

                    $deprecation$
                    public static final int $name$_VALUE = $number$;
                  )");
            }
          }},
         {"value_of_func",
          [&] {
            printer->Emit({{"cases",
                            [&] {
                              for (int i = start;
                                   i < std::min(start + kMaxEnums,
                                                (int)canonical_values.size());
                                   i++) {
                                printer->Emit(
                                    {{"name", canonical_values[i]->name()}},
                                    R"(
                                    case "$name$": return $name$;
                                    )");
                              }
                            }}},
                          R"(
                          switch (name) {
                            $cases$
                            default: return null;
                          }
                          )");
          }},
         {"for_number_func",
          [&] {
            printer->Emit(
                {{"cases",
                  [&] {
                    for (int i = start;
                         i < std::min(start + kMaxEnums,
                                      (int)canonical_values.size());
                         i++) {
                      printer->Emit(
                          {{"name", canonical_values[i]->name()},
                           {"number",
                            absl::StrCat(canonical_values[i]->number())}},
                          R"(
                            case $number$: return $name$;
                          )");
                    }
                  }}},
                R"(
                  switch (value) {
                    $cases$
                    default: return null;
                  }
                )");
          }},
         {"values_func",
          [&] {
            printer->Emit({{"values",
                            [&] {
                              std::vector<absl::string_view> values;
                              for (int i = start;
                                   i < std::min(start + kMaxEnums,
                                                (int)canonical_values.size());
                                   i++) {
                                values.push_back(canonical_values[i]->name());
                              }
                              printer->Emit(
                                  {{"values", absl::StrJoin(values, ", ")}},
                                  R"(
                                  $values$
                                  )");
                            }}},
                          R"(
                          return new $classname$[] {
                            $values$
                          };
                          )");
          }}},
        R"(
          interface $classname$$count$ {

            $enums$

            /**
             * @param value The numeric wire value of the corresponding enum entry.
             * @return The enum associated with the given numeric wire value.
             */
            $method_return_null_annotation$
            public static $classname$ forNumber$count$(int value) {
              $for_number_func$
            }

            /**
             * @param name The string name of the corresponding enum entry.
             * @return The enum associated with the given string name.
             */
            $method_return_null_annotation$
            public static $classname$ valueOf$count$(String name) {
              $value_of_func$
            }

            public static $classname$[] values$count$() {
              $values_func$
            }
          }
        )");
  }
}